

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::createProgram(FunctionalTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  long lVar7;
  GLint status;
  Shader shader [2];
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  shader[1].source =
       "#version 130\n\nuniform float color;\nuniform int   shall_pass;\n\nout vec4 pixel;\n\nvoid main()\n{\n    if(0 == shall_pass)\n    {\n        discard;\n    }\n\n    pixel = vec4(color);\n}\n"
  ;
  shader[1].type = 0x8b30;
  shader[1].id = 0;
  shader[0].source._0_4_ = 0x168d6b0;
  shader[0].source._4_4_ = 0;
  shader[0].type = 0x8b31;
  shader[0].id = 0;
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x17a);
  lVar7 = 0;
  do {
    if (lVar7 == 0x20) {
      (**(code **)(lVar5 + 0xce8))(this->m_po_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glTransformFeedbackVaryings call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x1a1);
      status = 0;
      (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82);
      if (status == 1) {
        for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
          if (*(int *)((long)&shader[0].id + lVar7) != 0) {
            (**(code **)(lVar5 + 0x4e0))(this->m_po_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"glDetachShader call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                            ,0x1af);
          }
        }
        for (lVar7 = 0xc; lVar7 != 0x2c; lVar7 = lVar7 + 0x10) {
          if (*(int *)((long)&shader[0].source + lVar7) != 0) {
            (**(code **)(lVar5 + 0x470))();
            *(undefined4 *)((long)&shader[0].source + lVar7) = 0;
          }
        }
        if (this->m_po_id != 0) {
          (**(code **)(lVar5 + 0x1680))();
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glUseProgram call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                          ,0x1d0);
        }
        return;
      }
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0;
      __cxa_throw(puVar6,&int::typeinfo,0);
    }
    if (*(long *)((long)&shader[0].source + lVar7) != 0) {
      uVar4 = (**(code **)(lVar5 + 0x3f0))(*(undefined4 *)((long)&shader[0].type + lVar7));
      *(undefined4 *)((long)&shader[0].id + lVar7) = uVar4;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x184);
      (**(code **)(lVar5 + 0x10))(this->m_po_id,*(undefined4 *)((long)&shader[0].id + lVar7));
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x188);
      (**(code **)(lVar5 + 0x12b8))
                (*(undefined4 *)((long)&shader[0].id + lVar7),1,(long)&shader[0].source + lVar7,0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x18c);
      (**(code **)(lVar5 + 0x248))(*(undefined4 *)((long)&shader[0].id + lVar7));
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,400);
      status = 0;
      (**(code **)(lVar5 + 0xa70))(*(undefined4 *)((long)&shader[0].id + lVar7),0x8b81,&status);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                      ,0x195);
      if (status == 0) {
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
    }
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::createProgram()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { s_vertex_shader, GL_VERTEX_SHADER, 0 }, { s_fragment_shader, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po_id, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po_id, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			throw 0;
		}
	}
	catch (...)
	{
		if (m_po_id)
		{
			gl.deleteProgram(m_po_id);

			m_po_id = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (m_po_id)
	{
		gl.useProgram(m_po_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");
	}
}